

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockedpool.cpp
# Opt level: O2

Stats * __thiscall LockedPool::stats(Stats *__return_storage_ptr__,LockedPool *this)

{
  _List_node_base *p_Var1;
  size_t sVar2;
  long in_FS_OFFSET;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  Stats i;
  Stats local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::mutex::lock(&this->mutex);
  __return_storage_ptr__->locked = this->cumulative_bytes_locked;
  sVar3 = 0;
  sVar4 = 0;
  sVar2 = 0;
  sVar5 = 0;
  sVar6 = 0;
  p_Var1 = (_List_node_base *)&this->arenas;
  while (p_Var1 = (((_List_base<LockedPool::LockedPageArena,_std::allocator<LockedPool::LockedPageArena>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)&this->arenas) {
    Arena::stats(&local_68,(Arena *)(p_Var1 + 1));
    sVar3 = sVar3 + local_68.used;
    sVar4 = sVar4 + local_68.free;
    sVar2 = sVar2 + local_68.total;
    sVar5 = sVar5 + local_68.chunks_used;
    sVar6 = sVar6 + local_68.chunks_free;
  }
  __return_storage_ptr__->total = sVar2;
  __return_storage_ptr__->chunks_used = sVar5;
  __return_storage_ptr__->chunks_free = sVar6;
  __return_storage_ptr__->used = sVar3;
  __return_storage_ptr__->free = sVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

LockedPool::Stats LockedPool::stats() const
{
    std::lock_guard<std::mutex> lock(mutex);
    LockedPool::Stats r{0, 0, 0, cumulative_bytes_locked, 0, 0};
    for (const auto &arena: arenas) {
        Arena::Stats i = arena.stats();
        r.used += i.used;
        r.free += i.free;
        r.total += i.total;
        r.chunks_used += i.chunks_used;
        r.chunks_free += i.chunks_free;
    }
    return r;
}